

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::ProfiledNewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  uint32 length;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  byte *pbVar5;
  Var newValue;
  JavascriptArray *this;
  uint uVar6;
  JavascriptLibrary *pJVar7;
  int in_stack_00000010;
  undefined1 local_50 [8];
  ArgumentReader args;
  CallInfo local_38;
  CallInfo callInfo_local;
  
  local_38 = callInfo;
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x455,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00b6d019;
    *puVar3 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_50 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_50,&local_38);
  bVar2 = VarIsImpl<Js::JavascriptFunction>(function);
  if ((!bVar2) ||
     (pJVar4 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(function),
     (pJVar4->functionInfo).ptr != (FunctionInfo *)EntryInfo::NewInstance)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x458,
                                "(VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance)"
                                ,
                                "VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance"
                               );
    if (!bVar2) goto LAB_00b6d019;
    *puVar3 = 0;
  }
  if (((ulong)local_38 & 0xfffffe) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x459,"(callInfo.Count >= 2)","callInfo.Count >= 2");
    if (!bVar2) goto LAB_00b6d019;
    *puVar3 = 0;
  }
  pbVar5 = (byte *)Arguments::operator[]((Arguments *)local_50,0);
  uVar6 = local_38._0_4_;
  if ((uVar6 & 0xffffff) != 2) {
    if ((pbVar5 == (byte *)0x0) || ((*pbVar5 & 2) != 0)) {
LAB_00b6cd7c:
      this = JavascriptLibrary::CreateArray
                       ((((function->type).ptr)->javascriptLibrary).ptr,(uVar6 & 0xffffff) - 1);
    }
    else {
      bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase);
      if (bVar2) {
        uVar6 = local_38._0_4_;
        goto LAB_00b6cd7c;
      }
      if (((*pbVar5 & 1) != 0) ||
         (bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase), bVar2)) {
        this = (JavascriptArray *)
               JavascriptLibrary::CreateNativeFloatArray
                         ((((function->type).ptr)->javascriptLibrary).ptr,
                          (local_38._0_4_ & 0xffffff) - 1);
      }
      else {
        this = (JavascriptArray *)
               JavascriptLibrary::CreateNativeIntArray
                         ((((function->type).ptr)->javascriptLibrary).ptr,
                          (local_38._0_4_ & 0xffffff) - 1);
      }
    }
    (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x76])
              (this,(ulong)((local_38._0_4_ & 0xffffff) - 1),0,args.super_Arguments.Info,pbVar5,0);
    goto LAB_00b6ce6c;
  }
  newValue = Arguments::operator[]((Arguments *)local_50,1);
  if (((ulong)newValue & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)newValue & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)newValue & 0xffff000000000000) == 0x1000000000000) goto LAB_00b6cdc5;
    if ((ulong)newValue >> 0x32 == 0) {
      this = JavascriptLibrary::CreateArray((((function->type).ptr)->javascriptLibrary).ptr,1);
      DirectSetItemAt<void*>(this,0,newValue);
      goto LAB_00b6ce6c;
    }
    args.super_Arguments.Values = (Type)((ulong)newValue ^ 0xfffc000000000000);
    length = JavascriptConversion::ToUInt32((double)args.super_Arguments.Values);
    if (((double)args.super_Arguments.Values != (double)length) ||
       (NAN((double)args.super_Arguments.Values) || NAN((double)length))) goto LAB_00b6d01b;
    if ((pbVar5 == (byte *)0x0) ||
       (((*pbVar5 & 2) != 0 ||
        (bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase), bVar2)))) {
      pJVar7 = (((function->type).ptr)->javascriptLibrary).ptr;
      goto LAB_00b6ce64;
    }
    if (((*pbVar5 & 1) != 0) ||
       (bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase), bVar2)) {
      pJVar7 = (((function->type).ptr)->javascriptLibrary).ptr;
      goto LAB_00b6cfa0;
    }
    pJVar7 = (((function->type).ptr)->javascriptLibrary).ptr;
  }
  else {
    AssertCount = AssertCount + 1;
    args.super_Arguments.Values = (Type)function;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b6d019;
    *puVar3 = 0;
    function = (RecyclableObject *)args.super_Arguments.Values;
LAB_00b6cdc5:
    if (((ulong)newValue & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00b6d019:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    length = (uint32)newValue;
    if ((int)length < 0) {
LAB_00b6d01b:
      JavascriptError::ThrowRangeError
                ((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr,-0x7ff5ec5b,(PCWSTR)0x0);
    }
    if (((pbVar5 == (byte *)0x0) || ((*pbVar5 & 2) != 0)) ||
       (bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase), bVar2)) {
      pJVar7 = (((function->type).ptr)->javascriptLibrary).ptr;
LAB_00b6ce64:
      this = JavascriptLibrary::CreateArray(pJVar7,length);
      goto LAB_00b6ce6c;
    }
    if (((*pbVar5 & 1) != 0) ||
       (bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase), bVar2)) {
      pJVar7 = (((function->type).ptr)->javascriptLibrary).ptr;
LAB_00b6cfa0:
      this = (JavascriptArray *)JavascriptLibrary::CreateNativeFloatArray(pJVar7,length);
      goto LAB_00b6ce6c;
    }
    pJVar7 = (((function->type).ptr)->javascriptLibrary).ptr;
  }
  this = (JavascriptArray *)JavascriptLibrary::CreateNativeIntArray(pJVar7,length);
LAB_00b6ce6c:
  (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(this);
  return this;
}

Assistant:

Var JavascriptArray::ProfiledNewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(ScrArr_ProfiledNewInstance);
        ARGUMENTS(args, callInfo);

        Assert(VarIs<JavascriptFunction>(function) &&
               VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance);
        Assert(callInfo.Count >= 2);

        ArrayCallSiteInfo *arrayInfo = (ArrayCallSiteInfo*)args[0];
        JavascriptArray* pNew = nullptr;

        if (callInfo.Count == 2)
        {
            // Exactly one argument, which is the array length if it's a uint32.
            Var firstArgument = args[1];
            int elementCount;
            if (TaggedInt::Is(firstArgument))
            {
                elementCount = TaggedInt::ToInt32(firstArgument);
                if (elementCount < 0)
                {
                    JavascriptError::ThrowRangeError(function->GetScriptContext(), JSERR_ArrayLengthConstructIncorrect);
                }
                if (arrayInfo && arrayInfo->IsNativeArray())
                {
                    if (arrayInfo->IsNativeIntArray())
                    {
                        pNew = function->GetLibrary()->CreateNativeIntArray(elementCount);
                    }
                    else
                    {
                        pNew = function->GetLibrary()->CreateNativeFloatArray(elementCount);
                    }
                }
                else
                {
                    pNew = function->GetLibrary()->CreateArray(elementCount);
                }
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(firstArgument))
            {
                // Non-tagged-int number: make sure the double value is really a uint32.
                double value = JavascriptNumber::GetValue(firstArgument);
                uint32 uvalue = JavascriptConversion::ToUInt32(value);
                if (value != uvalue)
                {
                    JavascriptError::ThrowRangeError(function->GetScriptContext(), JSERR_ArrayLengthConstructIncorrect);
                }
                if (arrayInfo && arrayInfo->IsNativeArray())
                {
                    if (arrayInfo->IsNativeIntArray())
                    {
                        pNew = function->GetLibrary()->CreateNativeIntArray(uvalue);
                    }
                    else
                    {
                        pNew = function->GetLibrary()->CreateNativeFloatArray(uvalue);
                    }
                }
                else
                {
                    pNew = function->GetLibrary()->CreateArray(uvalue);
                }
            }
            else
            {
                //
                // First element is not int/double
                // create an array of length 1.
                // Set first element as the passed Var
                //

                pNew = function->GetLibrary()->CreateArray(1);
                pNew->DirectSetItemAt<Var>(0, firstArgument);
            }
        }
        else
        {
            // Called with a list of initial element values.
            // Create an array of the appropriate length and walk the list.

            if (arrayInfo && arrayInfo->IsNativeArray())
            {
                if (arrayInfo->IsNativeIntArray())
                {
                    pNew = function->GetLibrary()->CreateNativeIntArray(callInfo.Count - 1);
                }
                else
                {
                    pNew = function->GetLibrary()->CreateNativeFloatArray(callInfo.Count - 1);
                }
            }
            else
            {
                pNew = function->GetLibrary()->CreateArray(callInfo.Count - 1);
            }
            pNew->FillFromArgs(callInfo.Count - 1, 0, args.Values, arrayInfo);
        }

#ifdef VALIDATE_ARRAY
        pNew->ValidateArray();
#endif
        return pNew;
        JIT_HELPER_END(ScrArr_ProfiledNewInstance);
    }